

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void get_range<float,long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
               long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  float fVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  ulong local_60;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar12 = Xc_indptr[col_num];
  lVar6 = Xc_indptr[col_num + 1];
  bVar13 = true;
  if (lVar6 != lVar12) {
    if (Xc_ind[lVar12] <= (long)ix_arr[end]) {
      lVar1 = lVar6 + -1;
      uVar7 = Xc_ind[lVar1];
      if ((long)ix_arr[st] <= (long)uVar7) {
        puVar3 = ix_arr + end;
        uVar11 = (end - st) + 1;
        if (((long)ix_arr[st] < Xc_ind[lVar12] || (ulong)(lVar6 - lVar12) < uVar11) ||
            (long)uVar7 < (long)ix_arr[end]) {
          *xmin = 0.0;
          *xmax = 0.0;
        }
        puVar2 = puVar3 + 1;
        if (missing_action == Fail) {
          puVar9 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                             (ix_arr + st,puVar2,Xc_ind + lVar12);
          local_60 = 0;
          do {
            puVar4 = (ulong *)(Xc_ind + lVar12);
            while( true ) {
              if (((puVar9 == puVar2) || (lVar12 == lVar6)) || (uVar8 = *puVar9, uVar7 < uVar8))
              goto LAB_00288616;
              if (*puVar4 == uVar8) {
                local_60 = local_60 + 1;
                dVar17 = (double)Xc[lVar12];
                dVar16 = dVar17;
                if (*xmin <= dVar17) {
                  dVar16 = *xmin;
                }
                *xmin = dVar16;
                if (dVar17 <= *xmax) {
                  dVar17 = *xmax;
                }
                *xmax = dVar17;
                if ((puVar9 == puVar3) || (lVar12 == lVar1)) goto LAB_00288616;
                puVar9 = puVar9 + 1;
                plVar10 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                    (puVar4,Xc_ind + lVar6,puVar9);
                goto LAB_00288605;
              }
              if ((long)*puVar4 <= (long)uVar8) break;
              puVar9 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar9 + 1,puVar2,puVar4);
            }
            plVar10 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                (puVar4 + 1,Xc_ind + lVar6,puVar9);
LAB_00288605:
            lVar12 = (long)plVar10 - (long)Xc_ind >> 3;
          } while( true );
        }
        puVar9 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                           (ix_arr + st,puVar2,Xc_ind + lVar12);
        local_60 = 0;
        do {
          puVar4 = (ulong *)(Xc_ind + lVar12);
          while( true ) {
            if (((puVar9 == puVar2) || (lVar12 == lVar6)) || (uVar8 = *puVar9, uVar7 < uVar8))
            goto LAB_00288616;
            if (*puVar4 == uVar8) {
              local_60 = local_60 + 1;
              fVar5 = Xc[lVar12];
              dVar17 = fmin(*xmin,(double)fVar5);
              *xmin = dVar17;
              dVar17 = fmax(*xmax,(double)fVar5);
              *xmax = dVar17;
              if ((puVar9 == puVar3) || (lVar12 == lVar1)) goto LAB_00288616;
              puVar9 = puVar9 + 1;
              plVar10 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                  (puVar4,Xc_ind + lVar6,puVar9);
              goto LAB_0028851f;
            }
            if ((long)*puVar4 <= (long)uVar8) break;
            puVar9 = std::__lower_bound<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar9 + 1,puVar2,puVar4);
          }
          plVar10 = std::__lower_bound<long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                              (puVar4 + 1,Xc_ind + lVar6,puVar9);
LAB_0028851f:
          lVar12 = (long)plVar10 - (long)Xc_ind >> 3;
        } while( true );
      }
    }
  }
LAB_00288693:
  *unsplittable = bVar13;
  return;
LAB_00288616:
  dVar17 = *xmin;
  uVar14 = SUB84(dVar17,0);
  uVar15 = (undefined4)((ulong)dVar17 >> 0x20);
  bVar13 = true;
  if (local_60 < uVar11) {
    if (0.0 <= dVar17) {
      uVar14 = 0;
      uVar15 = 0;
    }
    *xmin = (double)CONCAT44(uVar15,uVar14);
    dVar17 = *xmax;
    if (dVar17 <= 0.0) {
      dVar17 = 0.0;
    }
    *xmax = dVar17;
  }
  else {
    dVar17 = *xmax;
  }
  if ((((double)CONCAT44(uVar15,uVar14) != dVar17) ||
      (NAN((double)CONCAT44(uVar15,uVar14)) || NAN(dVar17))) &&
     ((double)CONCAT44(uVar15,uVar14) != INFINITY || dVar17 != -INFINITY)) {
    bVar13 = NAN(dVar17);
  }
  goto LAB_00288693;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}